

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hpp
# Opt level: O3

void boost::algorithm::trim_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
               is_any_ofF<char> *IsSpace)

{
  ulong uVar1;
  anon_union_16_2_ba345be5_for_m_Storage *__dest;
  anon_union_16_2_ba345be5_for_m_Storage *__dest_00;
  is_any_ofF<char> *__src;
  anon_union_16_2_ba345be5_for_m_Storage local_48;
  ulong local_38;
  anon_union_16_2_ba345be5_for_m_Storage local_30;
  ulong local_20;
  
  __dest_00 = &local_48;
  uVar1 = IsSpace->m_Size;
  local_30.m_dynSet = (set_value_type *)0x0;
  local_20 = uVar1;
  if (uVar1 < 0x11) {
    __dest = &local_30;
    __src = IsSpace;
  }
  else {
    __dest = (anon_union_16_2_ba345be5_for_m_Storage *)operator_new__(uVar1);
    __src = (is_any_ofF<char> *)(IsSpace->m_Storage).m_dynSet;
    local_30.m_dynSet = (set_value_type *)__dest;
  }
  memcpy(__dest,__src,uVar1);
  trim_right_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
            (Input,(is_any_ofF<char> *)&local_30);
  if ((0x10 < local_20) &&
     ((anon_union_16_2_ba345be5_for_m_Storage *)local_30.m_dynSet !=
      (anon_union_16_2_ba345be5_for_m_Storage *)0x0)) {
    operator_delete__(local_30.m_dynSet);
  }
  uVar1 = IsSpace->m_Size;
  local_48.m_dynSet = (set_value_type *)0x0;
  local_38 = uVar1;
  if (0x10 < uVar1) {
    __dest_00 = (anon_union_16_2_ba345be5_for_m_Storage *)operator_new__(uVar1);
    IsSpace = (is_any_ofF<char> *)(IsSpace->m_Storage).m_dynSet;
    local_48.m_dynSet = (set_value_type *)__dest_00;
  }
  memcpy(__dest_00,IsSpace,uVar1);
  trim_left_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
            (Input,(is_any_ofF<char> *)&local_48);
  if ((0x10 < local_38) && (local_48.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_48.m_dynSet);
  }
  return;
}

Assistant:

inline void trim_if(SequenceT& Input, PredicateT IsSpace)
        {
            ::boost::algorithm::trim_right_if( Input, IsSpace );
            ::boost::algorithm::trim_left_if( Input, IsSpace );
        }